

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_progress.c
# Opt level: O2

void progress_finalize(per_transfer *per)

{
  byte bVar1;
  
  all_dlalready = all_dlalready + per->dlnow;
  all_ulalready = all_ulalready + per->ulnow;
  bVar1 = per->field_0x1c0;
  if ((bVar1 & 1) == 0) {
    all_dltotal = all_dltotal + per->dltotal;
    bVar1 = bVar1 | 1;
    per->field_0x1c0 = bVar1;
  }
  if ((bVar1 & 2) == 0) {
    all_ultotal = all_ultotal + per->ultotal;
    per->field_0x1c0 = bVar1 | 2;
  }
  return;
}

Assistant:

void progress_finalize(struct per_transfer *per)
{
  /* get the numbers before this transfer goes away */
  all_dlalready += per->dlnow;
  all_ulalready += per->ulnow;
  if(!per->dltotal_added) {
    all_dltotal += per->dltotal;
    per->dltotal_added = TRUE;
  }
  if(!per->ultotal_added) {
    all_ultotal += per->ultotal;
    per->ultotal_added = TRUE;
  }
}